

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkFraigTrust(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  void *pvVar2;
  Abc_Aig_t *pMan;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *pVVar9;
  ProgressBar *p;
  Abc_Obj_t *pAVar10;
  long lVar11;
  long lVar12;
  char *__s;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *paVar13;
  long *plVar14;
  
  if ((pNtk->ntkFunc == ABC_FUNC_SOP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    pVVar9 = pNtk->vObjs;
    if (0 < pVVar9->nSize) {
      lVar11 = 0;
      do {
        pvVar2 = pVVar9->pArray[lVar11];
        if (((((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7)) &&
             (1 < *(int *)((long)pvVar2 + 0x1c))) &&
            ((*(int *)((long)pvVar2 + 0x1c) != 2 ||
             (iVar6 = Abc_SopIsAndType(*(char **)((long)pvVar2 + 0x38)), iVar6 == 0)))) &&
           (iVar6 = Abc_SopIsOrType(*(char **)((long)pvVar2 + 0x38)), iVar6 == 0)) {
          __s = "Abc_NtkFraigTrust: The network does not look like an AIG with choice nodes.";
          goto LAB_00257bf0;
        }
        lVar11 = lVar11 + 1;
        pVVar9 = pNtk->vObjs;
      } while (lVar11 < pVVar9->nSize);
    }
    pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    pVVar9 = Abc_NtkDfs(pNtk,0);
    p = Extra_ProgressBarStart(_stdout,pVVar9->nSize);
    if (0 < pVVar9->nSize) {
      lVar11 = 0;
      do {
        plVar14 = (long *)pVVar9->pArray[lVar11];
        if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar11)) {
          Extra_ProgressBarUpdate_int(p,(int)lVar11,(char *)0x0);
        }
        if ((*(uint *)((long)plVar14 + 0x14) & 0xf) != 7) {
          __assert_fail("Abc_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                        ,0x23d,"void Abc_NtkFraigTrustOne(Abc_Ntk_t *, Abc_Ntk_t *)");
        }
        iVar6 = *(int *)((long)plVar14 + 0x1c);
        iVar7 = Abc_SopGetVarNum((char *)plVar14[7]);
        if (iVar6 != iVar7) {
          __assert_fail("nFanins == Abc_SopGetVarNum((char *)pNode->pData)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                        ,0x262,"Abc_Obj_t *Abc_NodeFraigTrust(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        if (iVar6 == 2) {
          iVar6 = Abc_SopIsAndType((char *)plVar14[7]);
          if (iVar6 == 0) {
LAB_00257a79:
            iVar6 = Abc_SopIsOrType((char *)plVar14[7]);
            if (iVar6 == 0) {
              __assert_fail("Abc_SopIsOrType((char *)pNode->pData)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                            ,0x26c,"Abc_Obj_t *Abc_NodeFraigTrust(Abc_Ntk_t *, Abc_Obj_t *)");
            }
            iVar6 = Abc_SopGetIthCareLit((char *)plVar14[7],0);
            pAVar10 = *(Abc_Obj_t **)
                       (*(long *)(*(long *)(*(long *)(*plVar14 + 0x20) + 8) +
                                 (long)*(int *)plVar14[4] * 8) + 0x40);
            paVar13 = &pAVar10->field_5;
            if (0 < *(int *)((long)plVar14 + 0x1c)) {
              lVar12 = 0;
              do {
                if (lVar12 != 0) {
                  lVar5 = *(long *)(*(long *)(*(long *)(*plVar14 + 0x20) + 8) +
                                   (long)*(int *)(plVar14[4] + lVar12 * 4) * 8);
                  *paVar13 = *(anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)(lVar5 + 0x40);
                  paVar13 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)
                            (*(long *)(lVar5 + 0x40) + 0x38);
                  iVar7 = Abc_SopGetIthCareLit((char *)plVar14[7],(int)lVar12);
                  if (iVar6 != iVar7) {
                    puVar1 = (uint *)(*(long *)(lVar5 + 0x40) + 0x14);
                    *puVar1 = *puVar1 | 0x80;
                  }
                }
                lVar12 = lVar12 + 1;
              } while (lVar12 < *(int *)((long)plVar14 + 0x1c));
            }
            if (paVar13->pData != (void *)0x0) {
              __assert_fail("*ppTail == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                            ,0x27c,"Abc_Obj_t *Abc_NodeFraigTrust(Abc_Ntk_t *, Abc_Obj_t *)");
            }
          }
          else {
            pMan = (Abc_Aig_t *)pNtk_00->pManFunc;
            uVar3 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar14 + 0x20) + 8) +
                                        (long)*(int *)plVar14[4] * 8) + 0x40);
            iVar6 = Abc_SopGetIthCareLit((char *)plVar14[7],0);
            uVar4 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar14 + 0x20) + 8) +
                                        (long)*(int *)(plVar14[4] + 4) * 8) + 0x40);
            iVar7 = Abc_SopGetIthCareLit((char *)plVar14[7],1);
            pAVar10 = Abc_AigAnd(pMan,(Abc_Obj_t *)(iVar6 == 0 ^ uVar3),
                                 (Abc_Obj_t *)(iVar7 == 0 ^ uVar4));
          }
        }
        else {
          if (iVar6 == 1) {
            pAVar10 = *(Abc_Obj_t **)
                       (*(long *)(*(long *)(*(long *)(*plVar14 + 0x20) + 8) +
                                 (long)*(int *)plVar14[4] * 8) + 0x40);
            iVar6 = Abc_SopIsInv((char *)plVar14[7]);
          }
          else {
            if (iVar6 != 0) goto LAB_00257a79;
            pAVar10 = Abc_AigConst1(pNtk_00);
            iVar6 = Abc_SopIsConst0((char *)plVar14[7]);
          }
          pAVar10 = (Abc_Obj_t *)((ulong)(iVar6 != 0) ^ (ulong)pAVar10);
        }
        if (pNtk->ntkType == ABC_NTK_NETLIST) {
          plVar14 = *(long **)(*(long *)(*(long *)(*plVar14 + 0x20) + 8) +
                              (long)*(int *)plVar14[6] * 8);
        }
        if (plVar14[8] != 0) {
          __assert_fail("pObj->pCopy == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                        ,0x246,"void Abc_NtkFraigTrustOne(Abc_Ntk_t *, Abc_Ntk_t *)");
        }
        plVar14[8] = (long)pAVar10;
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar9->nSize);
    }
    if (pVVar9->pArray != (void **)0x0) {
      free(pVVar9->pArray);
      pVVar9->pArray = (void **)0x0;
    }
    if (pVVar9 != (Vec_Ptr_t *)0x0) {
      free(pVVar9);
    }
    Extra_ProgressBarStop(p);
    Abc_NtkFinalize(pNtk,pNtk_00);
    Abc_NtkReassignIds(pNtk_00);
    uVar8 = Abc_NtkGetChoiceNum(pNtk_00);
    printf("Warning: The resulting AIG contains %d choice nodes.\n",(ulong)uVar8);
    iVar6 = Abc_NtkCheck(pNtk_00);
    if (iVar6 != 0) {
      return pNtk_00;
    }
    puts("Abc_NtkFraigTrust: The network check has failed.");
    Abc_NtkDelete(pNtk_00);
  }
  else {
    __s = "Abc_NtkFraigTrust: Trust mode works for netlists and logic SOP networks.";
LAB_00257bf0:
    puts(__s);
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkFraigTrust( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;

    if ( !Abc_NtkIsSopLogic(pNtk) )
    {
        printf( "Abc_NtkFraigTrust: Trust mode works for netlists and logic SOP networks.\n" );
        return NULL;
    }

    if ( !Abc_NtkFraigTrustCheck(pNtk) )
    {
        printf( "Abc_NtkFraigTrust: The network does not look like an AIG with choice nodes.\n" );
        return NULL;
    }
    
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    Abc_NtkFraigTrustOne( pNtk, pNtkNew );
    Abc_NtkFinalize( pNtk, pNtkNew );
    Abc_NtkReassignIds( pNtkNew );

    // print a warning about choice nodes
    printf( "Warning: The resulting AIG contains %d choice nodes.\n", Abc_NtkGetChoiceNum( pNtkNew ) );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkFraigTrust: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}